

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteDouble
               (int field_number,double value,CodedOutputStream *output)

{
  uint32 value_00;
  uint64 value_01;
  CodedOutputStream *output_local;
  double value_local;
  int field_number_local;
  
  value_00 = MakeTag(field_number,WIRETYPE_FIXED64);
  io::CodedOutputStream::WriteTag(output,value_00);
  value_01 = EncodeDouble(value);
  io::CodedOutputStream::WriteLittleEndian64(output,value_01);
  return;
}

Assistant:

void WireFormatLite::WriteDouble(int field_number, double value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteDoubleNoTag(value, output);
}